

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateMapField
          (FieldGenerator *this,Printer *printer)

{
  Context *pCVar1;
  pointer pcVar2;
  ClassNameResolver *field;
  FieldDescriptor *pFVar3;
  FieldDescriptor *this_00;
  long *plVar4;
  ClassNameResolver *in_RCX;
  long lVar5;
  string_view text;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  JvmNameContext name_ctx;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  long alStack_570 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_550;
  long alStack_528 [5];
  undefined1 auStack_500 [39];
  anon_class_1_0_00000001 local_4d9;
  string local_4d8;
  undefined1 local_4b8 [56];
  code *local_480;
  byte local_478;
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  bool local_450;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_448;
  Sub local_400;
  char *local_348;
  size_type local_340;
  char local_338;
  undefined7 uStack_337;
  undefined8 uStack_330;
  char *local_328;
  size_type local_320;
  char local_318;
  undefined7 uStack_317;
  undefined8 uStack_310;
  char *local_308;
  size_type local_300;
  char local_2f8;
  undefined7 uStack_2f7;
  undefined8 uStack_2f0;
  char *local_2e8;
  size_type local_2e0;
  char local_2d8;
  undefined7 uStack_2d7;
  undefined8 uStack_2d0;
  char *local_2c8;
  size_type local_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  undefined8 uStack_2b0;
  char *local_2a8;
  size_type local_2a0;
  char local_298;
  undefined7 uStack_297;
  undefined8 uStack_290;
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  undefined2 local_1e0;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined2 local_190;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined2 local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined2 local_f0;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined2 local_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined2 local_50;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  
  auStack_500._16_8_ = 0x351d55;
  auStack_500._24_8_ = printer;
  field = java::Context::GetNameResolver(this->context_);
  auStack_500._16_8_ = 0x351d60;
  pFVar3 = java::MapKeyField(this->descriptor_);
  auStack_500._16_8_ = 0x351d6b;
  this_00 = java::MapValueField(this->descriptor_);
  auStack_500._16_8_ = 0x351d98;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"kt_key_type","");
  auStack_500._16_8_ = 0x351da8;
  kotlin::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_4d8,(_anonymous_namespace_ *)pFVar3,(FieldDescriptor *)field,in_RCX);
  auStack_500._16_8_ = 0x351dc2;
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_4b8,&local_248,&local_4d8);
  auStack_500._16_8_ = 0x351df1;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"kt_value_type","");
  auStack_500._16_8_ = 0x351e04;
  kotlin::(anonymous_namespace)::KotlinTypeName_abi_cxx11_
            (&local_288,(_anonymous_namespace_ *)this_00,(FieldDescriptor *)field,in_RCX);
  auStack_500._16_8_ = 0x351e1c;
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_400,&local_268,&local_288);
  auStack_500._16_8_ = 0x351e3a;
  vars.len_ = 2;
  vars.ptr_ = (pointer)local_4b8;
  io::Printer::WithDefs(&local_48,(Printer *)auStack_500._24_8_,vars,false);
  lVar5 = 0x170;
  do {
    if (local_4b8[lVar5 + -8] == '\x01') {
      auStack_500._16_8_ = 0x351e5f;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_500 + lVar5));
    }
    plVar4 = (long *)((long)alStack_528 + lVar5 + 0x10);
    if (plVar4 != *(long **)((long)alStack_528 + lVar5)) {
      auStack_500._16_8_ = 0x351e7b;
      operator_delete(*(long **)((long)alStack_528 + lVar5),*plVar4 + 1);
    }
    auStack_500._16_8_ = 0x351e8f;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)alStack_528 + lVar5 + -8)]._M_data)
              (&local_4d9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)((long)&vStack_550.
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          .
                          super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  + lVar5));
    plVar4 = (long *)((long)alStack_570 + lVar5 + 0x10);
    *(undefined1 *)((long)alStack_528 + lVar5 + -8) = 0xff;
    if (plVar4 != *(long **)((long)alStack_570 + lVar5)) {
      auStack_500._16_8_ = 0x351eaf;
      operator_delete(*(long **)((long)alStack_570 + lVar5),*plVar4 + 1);
    }
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    auStack_500._16_8_ = 0x351ed9;
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    auStack_500._16_8_ = 0x351ef6;
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    auStack_500._16_8_ = 0x351f11;
    operator_delete(local_4d8._M_dataplus._M_p,
                    CONCAT71(local_4d8.field_2._M_allocated_capacity._1_7_,
                             local_4d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    auStack_500._16_8_ = 0x351f2e;
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = &(this->context_->options_).generate_immutable_code;
  local_4d8._M_string_length = auStack_500._24_8_;
  local_4d8.field_2._M_local_buf[0] = this->lite_;
  auStack_500._16_8_ = 0x351f5d;
  text._M_str = 
  "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
  ;
  text._M_len = 0x113;
  io::Printer::Print<>((Printer *)auStack_500._24_8_,text);
  pFVar3 = this->descriptor_;
  pCVar1 = this->context_;
  local_98[4] = (pCVar1->options_).opensource_runtime;
  local_98[5] = (pCVar1->options_).annotate_code;
  local_98[0] = (pCVar1->options_).generate_immutable_code;
  local_98[1] = (pCVar1->options_).generate_mutable_code;
  local_98[2] = (pCVar1->options_).generate_shared_code;
  local_98[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x351f96;
  local_90._M_p = (pointer)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x351fba;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_50._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_50._1_1_ = (pCVar1->options_).jvm_dsl;
  auStack_500._16_8_ = 0x351fde;
  java::WriteFieldDocComment((Printer *)auStack_500._24_8_,pFVar3,(Options *)local_98,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    auStack_500._16_8_ = 0x351ffb;
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    auStack_500._16_8_ = 0x352018;
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  auStack_500._16_8_ = 0x35203f;
  local_2a8 = &local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"jvm_name","");
  if (local_2a8 == &local_298) {
    local_4b8._24_8_ = uStack_290;
    local_4b8._0_8_ = local_4b8 + 0x10;
  }
  else {
    local_4b8._0_8_ = local_2a8;
  }
  local_4b8._17_7_ = uStack_297;
  local_4b8[0x10] = local_298;
  local_4b8._8_8_ = local_2a0;
  local_2a0 = 0;
  local_298 = '\0';
  local_480 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4b8._32_8_ = &local_4d8;
  local_4b8._40_8_ = 0;
  local_4b8._48_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_478 = 1;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450 = false;
  auStack_500._16_8_ = 0x352101;
  local_470._M_p = (pointer)&local_460;
  local_2a8 = &local_298;
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x53a374);
  local_448._M_engaged = false;
  auStack_500._16_8_ = 0x352127;
  io::Printer::Emit((Printer *)auStack_500._24_8_,local_4b8,1,0x108,
                    "$kt_deprecation$ public val $kt_name$: com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n$  jvm_synthetic$$jvm_name$  get() = com.google.protobuf.kotlin.DslMap(\n    $kt_dsl_builder$.${$$kt_property_name$Map$}$\n  )\n"
                   );
  if (local_448._M_engaged == true) {
    auStack_500._16_8_ = 0x35213e;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_p != &local_460) {
    auStack_500._16_8_ = 0x35215d;
    operator_delete(local_470._M_p,
                    CONCAT71(local_460._M_allocated_capacity._1_7_,local_460._M_local_buf[0]) + 1);
  }
  auStack_500._16_8_ = 0x352172;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_478]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_4b8 + 0x20));
  local_478 = 0xff;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    auStack_500._16_8_ = 0x35218e;
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  if (local_2a8 != &local_298) {
    auStack_500._16_8_ = 0x3521ab;
    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
  }
  pFVar3 = this->descriptor_;
  pCVar1 = this->context_;
  local_e8[4] = (pCVar1->options_).opensource_runtime;
  local_e8[5] = (pCVar1->options_).annotate_code;
  local_e8[0] = (pCVar1->options_).generate_immutable_code;
  local_e8[1] = (pCVar1->options_).generate_mutable_code;
  local_e8[2] = (pCVar1->options_).generate_shared_code;
  local_e8[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x3521e6;
  local_e0._M_p = (pointer)&local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x35220a;
  local_c0._M_p = (pointer)&local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_a0._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_a0._1_1_ = (pCVar1->options_).jvm_dsl;
  auStack_500._16_8_ = 0x35222f;
  java::WriteFieldDocComment((Printer *)auStack_500._24_8_,pFVar3,(Options *)local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    auStack_500._16_8_ = 0x352259;
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    auStack_500._16_8_ = 0x352276;
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  auStack_500._16_8_ = 0x35229d;
  local_2c8 = &local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"jvm_name","");
  if (local_2c8 == &local_2b8) {
    local_4b8._24_8_ = uStack_2b0;
    local_4b8._0_8_ = local_4b8 + 0x10;
  }
  else {
    local_4b8._0_8_ = local_2c8;
  }
  local_4b8._17_7_ = uStack_2b7;
  local_4b8[0x10] = local_2b8;
  local_4b8._8_8_ = local_2c0;
  local_2c0 = 0;
  local_2b8 = '\0';
  local_480 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4b8._32_8_ = &local_4d8;
  local_4b8._40_8_ = 0;
  local_4b8._48_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_478 = 1;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450 = false;
  auStack_500._16_8_ = 0x352351;
  local_470._M_p = (pointer)&local_460;
  local_2c8 = &local_2b8;
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x53a374);
  local_448._M_engaged = false;
  auStack_500._16_8_ = 0x352377;
  io::Printer::Emit((Printer *)auStack_500._24_8_,local_4b8,1,0xf1,
                    "$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .put(key: $kt_key_type$, value: $kt_value_type$) {\n     $kt_dsl_builder$.${$put$capitalized_name$$}$(key, value)\n   }\n"
                   );
  if (local_448._M_engaged == true) {
    auStack_500._16_8_ = 0x35238e;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_p != &local_460) {
    auStack_500._16_8_ = 0x3523ad;
    operator_delete(local_470._M_p,
                    CONCAT71(local_460._M_allocated_capacity._1_7_,local_460._M_local_buf[0]) + 1);
  }
  auStack_500._16_8_ = 0x3523c2;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_478]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_4b8 + 0x20));
  local_478 = 0xff;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    auStack_500._16_8_ = 0x3523de;
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  if (local_2c8 != &local_2b8) {
    auStack_500._16_8_ = 0x3523fb;
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
  pFVar3 = this->descriptor_;
  pCVar1 = this->context_;
  local_138[4] = (pCVar1->options_).opensource_runtime;
  local_138[5] = (pCVar1->options_).annotate_code;
  local_138[0] = (pCVar1->options_).generate_immutable_code;
  local_138[1] = (pCVar1->options_).generate_mutable_code;
  local_138[2] = (pCVar1->options_).generate_shared_code;
  local_138[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x352436;
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x35245a;
  local_110._M_p = (pointer)&local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_f0._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_f0._1_1_ = (pCVar1->options_).jvm_dsl;
  auStack_500._16_8_ = 0x35247f;
  java::WriteFieldDocComment((Printer *)auStack_500._24_8_,pFVar3,(Options *)local_138,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p != &local_100) {
    auStack_500._16_8_ = 0x3524a9;
    operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    auStack_500._16_8_ = 0x3524c6;
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  auStack_500._16_8_ = 0x3524ed;
  local_2e8 = &local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"jvm_name","");
  if (local_2e8 == &local_2d8) {
    local_4b8._24_8_ = uStack_2d0;
    local_4b8._0_8_ = local_4b8 + 0x10;
  }
  else {
    local_4b8._0_8_ = local_2e8;
  }
  local_4b8._17_7_ = uStack_2d7;
  local_4b8[0x10] = local_2d8;
  local_4b8._8_8_ = local_2e0;
  local_2e0 = 0;
  local_2d8 = '\0';
  local_480 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4b8._32_8_ = &local_4d8;
  local_4b8._40_8_ = 0;
  local_4b8._48_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_478 = 1;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450 = false;
  auStack_500._16_8_ = 0x3525a1;
  local_470._M_p = (pointer)&local_460;
  local_2e8 = &local_2d8;
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x53a374);
  local_448._M_engaged = false;
  auStack_500._16_8_ = 0x3525c7;
  io::Printer::Emit((Printer *)auStack_500._24_8_,local_4b8,1,0x106,
                    "$jvm_synthetic$$jvm_name$@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .set(key: $kt_key_type$, value: $kt_value_type$) {\n     put(key, value)\n   }\n"
                   );
  if (local_448._M_engaged == true) {
    auStack_500._16_8_ = 0x3525de;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_p != &local_460) {
    auStack_500._16_8_ = 0x3525fd;
    operator_delete(local_470._M_p,
                    CONCAT71(local_460._M_allocated_capacity._1_7_,local_460._M_local_buf[0]) + 1);
  }
  auStack_500._16_8_ = 0x352612;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_478]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_4b8 + 0x20));
  local_478 = 0xff;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    auStack_500._16_8_ = 0x35262e;
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  if (local_2e8 != &local_2d8) {
    auStack_500._16_8_ = 0x35264b;
    operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
  }
  pFVar3 = this->descriptor_;
  pCVar1 = this->context_;
  local_188[4] = (pCVar1->options_).opensource_runtime;
  local_188[5] = (pCVar1->options_).annotate_code;
  local_188[0] = (pCVar1->options_).generate_immutable_code;
  local_188[1] = (pCVar1->options_).generate_mutable_code;
  local_188[2] = (pCVar1->options_).generate_shared_code;
  local_188[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x352686;
  local_180._M_p = (pointer)&local_170;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x3526aa;
  local_160._M_p = (pointer)&local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_140._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_140._1_1_ = (pCVar1->options_).jvm_dsl;
  auStack_500._16_8_ = 0x3526cf;
  java::WriteFieldDocComment((Printer *)auStack_500._24_8_,pFVar3,(Options *)local_188,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_p != &local_150) {
    auStack_500._16_8_ = 0x3526f9;
    operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    auStack_500._16_8_ = 0x352716;
    operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
  }
  auStack_500._16_8_ = 0x35273d;
  local_308 = &local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"jvm_name","");
  if (local_308 == &local_2f8) {
    local_4b8._24_8_ = uStack_2f0;
    local_4b8._0_8_ = local_4b8 + 0x10;
  }
  else {
    local_4b8._0_8_ = local_308;
  }
  local_4b8._17_7_ = uStack_2f7;
  local_4b8[0x10] = local_2f8;
  local_4b8._8_8_ = local_300;
  local_300 = 0;
  local_2f8 = '\0';
  local_480 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4b8._32_8_ = &local_4d8;
  local_4b8._40_8_ = 0;
  local_4b8._48_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_478 = 1;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450 = false;
  auStack_500._16_8_ = 0x3527f1;
  local_470._M_p = (pointer)&local_460;
  local_308 = &local_2f8;
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x53a374);
  local_448._M_engaged = false;
  auStack_500._16_8_ = 0x352817;
  io::Printer::Emit((Printer *)auStack_500._24_8_,local_4b8,1,0xe7,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .remove(key: $kt_key_type$) {\n     $kt_dsl_builder$.${$remove$capitalized_name$$}$(key)\n   }\n"
                   );
  if (local_448._M_engaged == true) {
    auStack_500._16_8_ = 0x35282e;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_p != &local_460) {
    auStack_500._16_8_ = 0x35284d;
    operator_delete(local_470._M_p,
                    CONCAT71(local_460._M_allocated_capacity._1_7_,local_460._M_local_buf[0]) + 1);
  }
  auStack_500._16_8_ = 0x352862;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_478]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_4b8 + 0x20));
  local_478 = 0xff;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    auStack_500._16_8_ = 0x35287e;
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  if (local_308 != &local_2f8) {
    auStack_500._16_8_ = 0x35289b;
    operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
  }
  pFVar3 = this->descriptor_;
  pCVar1 = this->context_;
  local_1d8[4] = (pCVar1->options_).opensource_runtime;
  local_1d8[5] = (pCVar1->options_).annotate_code;
  local_1d8[0] = (pCVar1->options_).generate_immutable_code;
  local_1d8[1] = (pCVar1->options_).generate_mutable_code;
  local_1d8[2] = (pCVar1->options_).generate_shared_code;
  local_1d8[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x3528d6;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x3528fa;
  local_1b0._M_p = (pointer)&local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_190._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_190._1_1_ = (pCVar1->options_).jvm_dsl;
  auStack_500._16_8_ = 0x35291f;
  java::WriteFieldDocComment((Printer *)auStack_500._24_8_,pFVar3,(Options *)local_1d8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    auStack_500._16_8_ = 0x352949;
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    auStack_500._16_8_ = 0x352966;
    operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
  }
  auStack_500._16_8_ = 0x35298d;
  local_328 = &local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"jvm_name","");
  if (local_328 == &local_318) {
    local_4b8._24_8_ = uStack_310;
    local_4b8._0_8_ = local_4b8 + 0x10;
  }
  else {
    local_4b8._0_8_ = local_328;
  }
  local_4b8._17_7_ = uStack_317;
  local_4b8[0x10] = local_318;
  local_4b8._8_8_ = local_320;
  local_320 = 0;
  local_318 = '\0';
  local_480 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4b8._32_8_ = &local_4d8;
  local_4b8._40_8_ = 0;
  local_4b8._48_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_478 = 1;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450 = false;
  auStack_500._16_8_ = 0x352a41;
  local_470._M_p = (pointer)&local_460;
  local_328 = &local_318;
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x53a374);
  local_448._M_engaged = false;
  auStack_500._16_8_ = 0x352a67;
  io::Printer::Emit((Printer *)auStack_500._24_8_,local_4b8,1,0x110,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .putAll(map: kotlin.collections.Map<$kt_key_type$, $kt_value_type$>) {\n     $kt_dsl_builder$.${$putAll$capitalized_name$$}$(map)\n   }\n"
                   );
  if (local_448._M_engaged == true) {
    auStack_500._16_8_ = 0x352a7e;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_p != &local_460) {
    auStack_500._16_8_ = 0x352a9d;
    operator_delete(local_470._M_p,
                    CONCAT71(local_460._M_allocated_capacity._1_7_,local_460._M_local_buf[0]) + 1);
  }
  auStack_500._16_8_ = 0x352ab2;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_478]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_4b8 + 0x20));
  local_478 = 0xff;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    auStack_500._16_8_ = 0x352ace;
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  if (local_328 != &local_318) {
    auStack_500._16_8_ = 0x352aeb;
    operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
  }
  pFVar3 = this->descriptor_;
  pCVar1 = this->context_;
  local_228[4] = (pCVar1->options_).opensource_runtime;
  local_228[5] = (pCVar1->options_).annotate_code;
  local_228[0] = (pCVar1->options_).generate_immutable_code;
  local_228[1] = (pCVar1->options_).generate_mutable_code;
  local_228[2] = (pCVar1->options_).generate_shared_code;
  local_228[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x352b26;
  local_220._M_p = (pointer)&local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  auStack_500._16_8_ = 0x352b4a;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_1e0._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_1e0._1_1_ = (pCVar1->options_).jvm_dsl;
  auStack_500._16_8_ = 0x352b6f;
  java::WriteFieldDocComment((Printer *)auStack_500._24_8_,pFVar3,(Options *)local_228,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    auStack_500._16_8_ = 0x352b91;
    operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_p != &local_210) {
    auStack_500._16_8_ = 0x352bae;
    operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
  }
  auStack_500._16_8_ = 0x352bd6;
  local_348 = &local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"jvm_name","");
  if (local_348 == &local_338) {
    local_4b8._24_8_ = uStack_330;
    local_4b8._0_8_ = local_4b8 + 0x10;
  }
  else {
    local_4b8._0_8_ = local_348;
  }
  local_4b8._17_7_ = uStack_337;
  local_4b8[0x10] = local_338;
  local_4b8._8_8_ = local_340;
  local_340 = 0;
  local_338 = '\0';
  local_480 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_4b8._32_8_ = &local_4d8;
  local_4b8._40_8_ = 0;
  local_4b8._48_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_478 = 1;
  local_470._M_p = (pointer)&local_460;
  local_468 = 0;
  local_460._M_local_buf[0] = '\0';
  local_450 = false;
  auStack_500._16_8_ = 0x352c8d;
  local_348 = &local_338;
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)0x0,0x53a374);
  local_448._M_engaged = false;
  auStack_500._16_8_ = 0x352cb3;
  io::Printer::Emit((Printer *)auStack_500._24_8_,local_4b8,1,0xd0,
                    "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslMap<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n  .clear() {\n     $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n   }\n"
                   );
  if (local_448._M_engaged == true) {
    auStack_500._16_8_ = 0x352cca;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_448);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_p != &local_460) {
    auStack_500._16_8_ = 0x352cf0;
    operator_delete(local_470._M_p,
                    CONCAT71(local_460._M_allocated_capacity._1_7_,local_460._M_local_buf[0]) + 1);
  }
  auStack_500._16_8_ = 0x352d05;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_478]._M_data)
            ((anon_class_1_0_00000001 *)&local_288,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_4b8 + 0x20));
  local_478 = 0xff;
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    auStack_500._16_8_ = 0x352d21;
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  if (local_348 != &local_338) {
    auStack_500._16_8_ = 0x352d3e;
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  auStack_500._16_8_ = 0x352d4b;
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_48);
  return;
}

Assistant:

void FieldGenerator::GenerateMapField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  const FieldDescriptor* key = java::MapKeyField(descriptor_);
  const FieldDescriptor* value = java::MapValueField(descriptor_);
  auto cleanup = printer->WithVars(
      {{"kt_key_type", KotlinTypeName(key, name_resolver)},
       {"kt_value_type", KotlinTypeName(value, name_resolver)}});

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  printer->Print(
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("get$kt_capitalized_name$Map", name_ctx); }},
      },
      "$kt_deprecation$ public val $kt_name$: "
      "com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "$  jvm_synthetic$"
      "$jvm_name$"
      "  get() = com.google.protobuf.kotlin.DslMap(\n"
      "    $kt_dsl_builder$.${$$kt_property_name$Map$}$\n"
      "  )\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("put$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .put(key: $kt_key_type$, value: $kt_value_type$) {\n"
      "     $kt_dsl_builder$.${$put$capitalized_name$$}$(key, value)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("set$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .set(key: $kt_key_type$, value: $kt_value_type$) {\n"
      "     put(key, value)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("remove$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .remove(key: $kt_key_type$) {\n"
      "     $kt_dsl_builder$.${$remove$capitalized_name$$}$(key)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("putAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .putAll(map: kotlin.collections.Map<$kt_key_type$, $kt_value_type$>) "
      "{\n"
      "     $kt_dsl_builder$.${$putAll$capitalized_name$$}$(map)\n"
      "   }\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("clear$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslMap"
      "<$kt_key_type$, $kt_value_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "  .clear() {\n"
      "     $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "   }\n");
}